

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Config * __thiscall Catch::Session::config(Session *this)

{
  bool bVar1;
  element_type *peVar2;
  undefined1 local_20 [24];
  Session *this_local;
  
  local_20._16_8_ = this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_config);
  if (!bVar1) {
    std::make_shared<Catch::Config,Catch::ConfigData&>((ConfigData *)local_20);
    clara::std::shared_ptr<Catch::Config>::operator=
              (&this->m_config,(shared_ptr<Catch::Config> *)local_20);
    clara::std::shared_ptr<Catch::Config>::~shared_ptr((shared_ptr<Catch::Config> *)local_20);
  }
  peVar2 = clara::std::__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->m_config);
  return peVar2;
}

Assistant:

Config& Session::config() {
        if( !m_config )
            m_config = std::make_shared<Config>( m_configData );
        return *m_config;
    }